

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O2

void __thiscall
ClCommandLine_DoubleDashSwitchToPositional_Test::~ClCommandLine_DoubleDashSwitchToPositional_Test
          (ClCommandLine_DoubleDashSwitchToPositional_Test *this)

{
  anon_unknown.dwarf_1ee32::ClCommandLine::~ClCommandLine(&this->super_ClCommandLine);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, DoubleDashSwitchToPositional) {
    opt<std::string> opt{"opt"};
    list<std::string> p{"names", positional};

    this->add ("progname", "--", "-opt", "foo");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (opt.get_num_occurrences (), 0U);
    EXPECT_EQ (opt.get (), "");
    EXPECT_THAT (p, ::testing::ElementsAre ("-opt", "foo"));
}